

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall trieste::SymtabDef::str(SymtabDef *this,ostream *out,size_t level)

{
  type *this_00;
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  size_type sVar4;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  Token *pTVar5;
  char *pcVar6;
  element_type *peVar7;
  Location *this_02;
  string_view sVar8;
  indent local_c0;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_b8;
  shared_ptr<trieste::NodeDef> *node_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  *__range1_1;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_90;
  shared_ptr<trieste::NodeDef> *node;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  indent local_60;
  type *local_58;
  type *sym;
  type *loc;
  _Self local_40;
  iterator __end1;
  iterator __begin1;
  map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
  *__range1;
  size_t local_20;
  size_t level_local;
  ostream *out_local;
  SymtabDef *this_local;
  
  local_20 = level;
  level_local = (size_t)out;
  out_local = (ostream *)this;
  trieste::indent::indent((indent *)&__range1,level);
  poVar2 = trieste::operator<<(out,(indent)__range1);
  std::operator<<(poVar2,"{");
  __end1 = CLI::std::
           map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
           ::begin(&this->symbols);
  local_40._M_node =
       (_Base_ptr)
       CLI::std::
       map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
       ::end(&this->symbols);
  while (bVar1 = CLI::std::operator==(&__end1,&local_40), ((bVar1 ^ 0xffU) & 1) != 0) {
    loc = &CLI::std::
           _Rb_tree_iterator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
           ::operator*(&__end1)->first;
    sym = (type *)std::
                  get<0ul,trieste::Location_const,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>
                            ((pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                              *)loc);
    local_58 = std::
               get<1ul,trieste::Location_const,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>
                         ((pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                           *)loc);
    poVar2 = (ostream *)
             std::ostream::operator<<((void *)level_local,std::endl<char,std::char_traits<char>>);
    trieste::indent::indent(&local_60,local_20 + 1);
    poVar2 = trieste::operator<<(poVar2,local_60);
    sVar8 = Location::view((Location *)sym);
    pbVar3 = std::operator<<(poVar2,sVar8);
    std::operator<<(pbVar3," =");
    sVar4 = CLI::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::size(local_58);
    this_00 = local_58;
    if (sVar4 == 1) {
      poVar2 = std::operator<<((ostream *)level_local," ");
      this_01 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                CLI::std::
                vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ::back(local_58);
      peVar7 = CLI::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      pTVar5 = NodeDef::type(peVar7);
      pcVar6 = Token::str(pTVar5);
      std::operator<<(poVar2,pcVar6);
    }
    else {
      __end3 = CLI::std::
               vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ::begin(local_58);
      node = (shared_ptr<trieste::NodeDef> *)
             CLI::std::
             vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ::end(this_00);
      while (bVar1 = __gnu_cxx::
                     operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                               (&__end3,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                         *)&node), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_90 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                      ::operator*(&__end3);
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           ((void *)level_local,std::endl<char,std::char_traits<char>>);
        trieste::indent::indent((indent *)&__range1_1,local_20 + 2);
        poVar2 = trieste::operator<<(poVar2,(indent)__range1_1);
        peVar7 = CLI::std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_90);
        pTVar5 = NodeDef::type(peVar7);
        pcVar6 = Token::str(pTVar5);
        std::operator<<(poVar2,pcVar6);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
        ::operator++(&__end3);
      }
    }
    CLI::std::
    _Rb_tree_iterator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = CLI::std::
             vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ::begin(&this->includes);
  node_1 = (shared_ptr<trieste::NodeDef> *)
           CLI::std::
           vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ::end(&this->includes);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                           (&__end1_1,
                            (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                             *)&node_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_b8 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
               ::operator*(&__end1_1);
    poVar2 = (ostream *)
             std::ostream::operator<<((void *)level_local,std::endl<char,std::char_traits<char>>);
    trieste::indent::indent(&local_c0,local_20 + 1);
    poVar2 = trieste::operator<<(poVar2,local_c0);
    poVar2 = std::operator<<(poVar2,"include ");
    peVar7 = CLI::std::
             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_b8);
    this_02 = NodeDef::location(peVar7);
    sVar8 = Location::view(this_02);
    std::operator<<(poVar2,sVar8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)level_local,"}");
  return;
}

Assistant:

inline void SymtabDef::str(std::ostream& out, size_t level)
  {
    out << indent(level) << "{";

    for (auto& [loc, sym] : symbols)
    {
      out << std::endl << indent(level + 1) << loc.view() << " =";

      if (sym.size() == 1)
      {
        out << " " << sym.back()->type().str();
      }
      else
      {
        for (auto& node : sym)
          out << std::endl << indent(level + 2) << node->type().str();
      }
    }

    for (auto& node : includes)
    {
      out << std::endl
          << indent(level + 1) << "include " << node->location().view();
    }

    out << "}";
  }